

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void SubtractionHelper<int,unsigned_long_long,10>::
     SubtractThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (int *lhs,unsigned_long_long *rhs,int *result)

{
  ulong uVar1;
  uint32_t uVar2;
  int *in_RDX;
  ulong *in_RSI;
  int *in_RDI;
  uint64_t AbsMinIntT;
  
  if (*in_RDI < 0) {
    uVar1 = *in_RSI;
    uVar2 = AbsValueHelper<int,_0>::Abs(0);
    if (0x80000000 - (ulong)uVar2 < uVar1) {
LAB_001d5fc2:
      safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
    }
    *in_RDX = *in_RDI - (int)*in_RSI;
  }
  else {
    if ((long)*in_RDI + 0x80000000U < *in_RSI) goto LAB_001d5fc2;
    *in_RDX = *in_RDI - (int)*in_RSI;
  }
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void SubtractThrow( const T& lhs, const U& rhs, T& result ) SAFEINT_CPP_THROW
    {
        // lhs is any signed int, rhs unsigned int64
        // check against available range

        // We need the absolute value of std::numeric_limits<T>::min()
        // This will give it to us without extraneous compiler warnings
        SAFEINT_CONSTEXPR11 std::uint64_t AbsMinIntT = (std::uint64_t)std::numeric_limits<T>::max() + 1;

        if( lhs < 0 )
        {
            if( rhs <= AbsMinIntT - AbsValueHelper< T, GetAbsMethod< T >::method >::Abs( lhs ) )
            {
                result = (T)( lhs - rhs );
                return;
            }
        }
        else
        {
            if( rhs <= AbsMinIntT + (std::uint64_t)lhs )
            {
                result = (T)( lhs - rhs );
                return;
            }
        }

        E::SafeIntOnOverflow();
    }